

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::Write<char_const(&)[4],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [4],Newline *u)

{
  size_t size;
  
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }